

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.cpp
# Opt level: O0

size_t fsst_compress(fsst_encoder_t *encoder,size_t nlines,size_t *lenIn,u8 **strIn,size_t size,
                    u8 *output,size_t *lenOut,u8 **strOut)

{
  size_t sVar1;
  size_t in_RCX;
  u8 **in_RDX;
  size_t *in_RSI;
  size_t in_RDI;
  u8 *in_R8;
  Encoder *unaff_retaddr;
  int simd;
  size_t totLen;
  
  std::accumulate<unsigned_long_const*,int>
            ((unsigned_long *)in_RDX,(unsigned_long *)(in_RDX + (long)in_RSI),0);
  sVar1 = libfsst::_compressAuto
                    (unaff_retaddr,in_RDI,in_RSI,in_RDX,in_RCX,in_R8,(size_t *)totLen,(u8 **)output,
                     (int)size);
  return sVar1;
}

Assistant:

size_t fsst_compress(fsst_encoder_t *encoder, size_t nlines, const size_t lenIn[], const u8 *strIn[], size_t size, u8 *output, size_t *lenOut, u8 *strOut[]) {
   // to be faster than scalar, simd needs 64 lines or more of length >=12; or fewer lines, but big ones (totLen > 32KB)
   size_t totLen = accumulate(lenIn, lenIn+nlines, 0);
   int simd = totLen > nlines*12 && (nlines > 64 || totLen > (size_t) 1<<15); 
   return _compressAuto((Encoder*) encoder, nlines, lenIn, strIn, size, output, lenOut, strOut, 3*simd);
}